

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O3

void * testfunc_thread_starter(void *arg)

{
  int iVar1;
  Ref local_18;
  
  local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)arg + 8);
  local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)arg + 0x10);
  if (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  trun::TestRunner::SetCurrentTestModule(&local_18);
  if (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  trun::TestRunner::SetCurrentTestRunner(*(TestRunner **)((long)arg + 0x18));
  iVar1 = trun::TestFuncExecutorSequential::Execute
                    (*(TestFuncExecutorSequential **)((long)arg + 0x38),*arg,
                     *(CBPrePostHook **)((long)arg + 0x20),*(CBPrePostHook **)((long)arg + 0x28));
  *(int *)((long)arg + 0x30) = iVar1;
  return (void *)0x0;
}

Assistant:

static void *testfunc_thread_starter(void *arg) {
    auto threadArg = reinterpret_cast<ThreadArg *>(arg);

    TestRunner::SetCurrentTestModule(threadArg->testModule);
    TestRunner::SetCurrentTestRunner(threadArg->testRunner);

    threadArg->returnValue = threadArg->executor->ThreadFunc(threadArg->testFunc, threadArg->cbPreHook, threadArg->cbPostHook);
    // Return NULL here as this is a C callback..
    return NULL;
}